

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestJson.cpp
# Opt level: O0

void testJson(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  HashMap<String,_Variant> *pHVar5;
  Variant *pVVar6;
  String *pSVar7;
  List<Variant> *pLVar8;
  String local_530;
  Iterator local_508;
  String local_500;
  Iterator local_4d8;
  String local_4d0;
  String local_4a8;
  String local_480;
  Iterator local_458;
  Iterator local_450;
  Iterator local_448;
  String local_440;
  String local_418;
  String local_3f0;
  Iterator local_3c8;
  Iterator local_3c0;
  Iterator local_3b8;
  String local_3b0;
  String local_388;
  String local_360;
  Iterator local_338;
  Iterator local_330;
  Iterator local_328;
  String local_320;
  String local_2f8;
  String local_2d0;
  Iterator local_2a8;
  Iterator local_2a0;
  Iterator local_298;
  String local_290;
  String local_268;
  String local_240;
  Iterator local_218;
  Iterator local_210;
  Iterator local_208;
  String local_200;
  String local_1d8;
  String local_1b0;
  Iterator local_188;
  Iterator local_180;
  Iterator local_178;
  String local_170;
  Iterator local_148;
  String local_140;
  Iterator local_118;
  String local_110;
  String local_e8;
  undefined1 local_c0 [8];
  String surrogatePairCheck;
  Iterator local_70;
  undefined1 local_68 [8];
  String input;
  undefined1 local_30 [8];
  Variant data;
  Parser parser;
  
  Json::Parser::Parser((Parser *)&data._data.ref);
  Variant::Variant((Variant *)local_30);
  String::String<353ul>
            ((String *)local_68,
             (char (*) [353])
             "{\n  \"title\": \"Example Schema\",\n  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n  \"type\": \"object\",\n  \"properties\": {\n    \"firstName\": {\n      \"type\": \"string\"\n    },\n    \"lastName\": {\n      \"type\": \"string\"\n    },\n    \"age\": {\n      \"description\": \"Age in years\",\n      \"type\": \"integer\",\n      \"minimum\": 0\n    }\n  },\n  \"required\": [\"firstName\", \"lastName\"]\n}\n"
            );
  bVar2 = Json::Parser::parse((Parser *)&data._data.ref,(String *)local_68,(Variant *)local_30);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1d,"parser.parse(input, data)");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<6ul>((String *)&surrogatePairCheck._data.ref,(char (*) [6])"title");
  local_70 = HashMap<String,_Variant>::find(pHVar5,(String *)&surrogatePairCheck._data.ref);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_70);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [15])"Example Schema");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1e,"data.toMap().find(\"title\")->toString() == \"Example Schema\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String((String *)&surrogatePairCheck._data.ref);
  String::String((String *)local_c0);
  String::String<3ul>(&local_e8,(char (*) [3])"aa");
  String::append((String *)local_c0,&local_e8);
  String::~String(&local_e8);
  Unicode::append(0x1d11e,(String *)local_c0);
  String::String<3ul>(&local_110,(char (*) [3])"bb");
  String::append((String *)local_c0,&local_110);
  String::~String(&local_110);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<14ul>(&local_140,(char (*) [14])"surrogatePair");
  local_118 = HashMap<String,_Variant>::find(pHVar5,&local_140);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_118);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(String *)local_c0);
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x23,
                          "data.toMap().find(\"surrogatePair\")->toString() == surrogatePairCheck");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_140);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<5ul>(&local_170,(char (*) [5])"type");
  local_148 = HashMap<String,_Variant>::find(pHVar5,&local_170);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_148);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [7])"object");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x24,"data.toMap().find(\"type\")->toString() == \"object\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_170);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_1b0,(char (*) [11])"properties");
  local_188 = HashMap<String,_Variant>::find(pHVar5,&local_1b0);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_188);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<10ul>(&local_1d8,(char (*) [10])"firstName");
  local_180 = HashMap<String,_Variant>::find(pHVar5,&local_1d8);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_180);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<5ul>(&local_200,(char (*) [5])"type");
  local_178 = HashMap<String,_Variant>::find(pHVar5,&local_200);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_178);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [7])"string");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x25,
                          "data.toMap().find(\"properties\")->toMap().find(\"firstName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_200);
  String::~String(&local_1d8);
  String::~String(&local_1b0);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_240,(char (*) [11])"properties");
  local_218 = HashMap<String,_Variant>::find(pHVar5,&local_240);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_218);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<9ul>(&local_268,(char (*) [9])"lastName");
  local_210 = HashMap<String,_Variant>::find(pHVar5,&local_268);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_210);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<5ul>(&local_290,(char (*) [5])"type");
  local_208 = HashMap<String,_Variant>::find(pHVar5,&local_290);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_208);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [7])"string");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x26,
                          "data.toMap().find(\"properties\")->toMap().find(\"lastName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_290);
  String::~String(&local_268);
  String::~String(&local_240);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_2d0,(char (*) [11])"properties");
  local_2a8 = HashMap<String,_Variant>::find(pHVar5,&local_2d0);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_2a8);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<4ul>(&local_2f8,(char (*) [4])"age");
  local_2a0 = HashMap<String,_Variant>::find(pHVar5,&local_2f8);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_2a0);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<12ul>(&local_320,(char (*) [12])"description");
  local_298 = HashMap<String,_Variant>::find(pHVar5,&local_320);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_298);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [13])"Age in years");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x27,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"description\")->toString() == \"Age in years\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_320);
  String::~String(&local_2f8);
  String::~String(&local_2d0);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_360,(char (*) [11])"properties");
  local_338 = HashMap<String,_Variant>::find(pHVar5,&local_360);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_338);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<4ul>(&local_388,(char (*) [4])"age");
  local_330 = HashMap<String,_Variant>::find(pHVar5,&local_388);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_330);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<5ul>(&local_3b0,(char (*) [5])"type");
  local_328 = HashMap<String,_Variant>::find(pHVar5,&local_3b0);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_328);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [8])"integer");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x28,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"type\")->toString() == \"integer\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_3b0);
  String::~String(&local_388);
  String::~String(&local_360);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_3f0,(char (*) [11])"properties");
  local_3c8 = HashMap<String,_Variant>::find(pHVar5,&local_3f0);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_3c8);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<4ul>(&local_418,(char (*) [4])"age");
  local_3c0 = HashMap<String,_Variant>::find(pHVar5,&local_418);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_3c0);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<8ul>(&local_440,(char (*) [8])"minimum");
  local_3b8 = HashMap<String,_Variant>::find(pHVar5,&local_440);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_3b8);
  TVar4 = Variant::getType(pVVar6);
  if (TVar4 != intType) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x29,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->getType() == Variant::intType"
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_440);
  String::~String(&local_418);
  String::~String(&local_3f0);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<11ul>(&local_480,(char (*) [11])"properties");
  local_458 = HashMap<String,_Variant>::find(pHVar5,&local_480);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_458);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<4ul>(&local_4a8,(char (*) [4])"age");
  local_450 = HashMap<String,_Variant>::find(pHVar5,&local_4a8);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_450);
  pHVar5 = Variant::toMap(pVVar6);
  String::String<8ul>(&local_4d0,(char (*) [8])"minimum");
  local_448 = HashMap<String,_Variant>::find(pHVar5,&local_4d0);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_448);
  iVar3 = Variant::toInt(pVVar6);
  if (iVar3 != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2a,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->toInt() == 0"
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_4d0);
  String::~String(&local_4a8);
  String::~String(&local_480);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<9ul>(&local_500,(char (*) [9])"required");
  local_4d8 = HashMap<String,_Variant>::find(pHVar5,&local_500);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_4d8);
  pLVar8 = Variant::toList(pVVar6);
  pVVar6 = List<Variant>::front(pLVar8);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [10])"firstName");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2b,
                          "data.toMap().find(\"required\")->toList().front().toString() == \"firstName\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_500);
  pHVar5 = Variant::toMap((Variant *)local_30);
  String::String<9ul>(&local_530,(char (*) [9])"required");
  local_508 = HashMap<String,_Variant>::find(pHVar5,&local_530);
  pVVar6 = HashMap<String,_Variant>::Iterator::operator->(&local_508);
  pLVar8 = Variant::toList(pVVar6);
  pVVar6 = List<Variant>::back(pLVar8);
  pSVar7 = Variant::toString(pVVar6);
  bVar2 = String::operator==(pSVar7,(char (*) [9])"lastName");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2c,
                          "data.toMap().find(\"required\")->toList().back().toString() == \"lastName\""
                         );
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_530);
  String::~String((String *)local_c0);
  String::~String((String *)local_68);
  Variant::~Variant((Variant *)local_30);
  Json::Parser::~Parser((Parser *)&data._data.ref);
  return;
}

Assistant:

void testJson()
{
  Json::Parser parser;
  Variant data;
  String input("{\n"
"  \"title\": \"Example Schema\",\n"
"  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n"
"  \"type\": \"object\",\n"
"  \"properties\": {\n"
"    \"firstName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"lastName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"age\": {\n"
"      \"description\": \"Age in years\",\n"
"      \"type\": \"integer\",\n"
"      \"minimum\": 0\n"
"    }\n"
"  },\n"
"  \"required\": [\"firstName\", \"lastName\"]\n"
"}\n");
  ASSERT(parser.parse(input, data));
  ASSERT(data.toMap().find("title")->toString() == "Example Schema");
  String surrogatePairCheck;
  surrogatePairCheck.append("aa");
  Unicode::append(0x1d11e, surrogatePairCheck);
  surrogatePairCheck.append("bb");
  ASSERT(data.toMap().find("surrogatePair")->toString() == surrogatePairCheck);
  ASSERT(data.toMap().find("type")->toString() ==  "object");
  ASSERT(data.toMap().find("properties")->toMap().find("firstName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("lastName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("description")->toString() == "Age in years");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("type")->toString() == "integer");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->getType() == Variant::intType);
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->toInt() == 0);
  ASSERT(data.toMap().find("required")->toList().front().toString() == "firstName");
  ASSERT(data.toMap().find("required")->toList().back().toString() == "lastName");
}